

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiGpj.cxx
# Opt level: O1

void GhsMultiGpj::WriteGpjTag(Types gpjType,ostream *fout)

{
  size_t sVar1;
  char *__s;
  
  if (gpjType < (CUSTOM_TARGET|LIBRARY)) {
    __s = GHS_TAG[gpjType];
  }
  else {
    __s = "";
  }
  if (__s == (char *)0x0) {
    std::ios::clear((int)fout + (int)fout->_vptr_basic_ostream[-3]);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(fout,__s,sVar1);
  }
  std::ios::widen((char)fout->_vptr_basic_ostream[-3] + (char)fout);
  std::ostream::put((char)fout);
  std::ostream::flush();
  return;
}

Assistant:

void GhsMultiGpj::WriteGpjTag(Types gpjType, std::ostream& fout)
{
  char const* tag;
  tag = GhsMultiGpj::GetGpjTag(gpjType);
  fout << tag << std::endl;
}